

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O0

Vertex * Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                   (Vertex *__return_storage_ptr__,Vertex *v0,ai_real f)

{
  aiVector3D *paVar1;
  aiColor4D *paVar2;
  aiVector3t<float> aVar3;
  aiColor4t<float> aVar4;
  Vertex *res;
  undefined4 uStack_e0;
  undefined8 local_dc;
  uint local_d4;
  undefined4 uStack_d0;
  uint i_1;
  float local_c8;
  multiplies<aiVector3t<float>,_float,_aiVector3t<float>_> local_b9;
  undefined8 local_b8;
  float local_b0;
  uint local_ac;
  undefined4 uStack_a8;
  uint i;
  float local_a0;
  multiplies<aiVector3t<float>,_float,_aiVector3t<float>_> local_95;
  undefined8 local_94;
  float local_8c;
  aiVector3t<float> local_88;
  multiplies<aiVector3t<float>,_float,_aiVector3t<float>_> local_71;
  undefined8 local_70;
  float local_68;
  aiVector3t<float> local_60;
  multiplies<aiVector3t<float>,_float,_aiVector3t<float>_> local_49;
  undefined8 local_48;
  float local_40;
  aiVector3t<float> local_38;
  multiplies<aiVector3t<float>,_float,_aiVector3t<float>_> local_21;
  undefined8 local_20;
  float local_18;
  ai_real local_14;
  Vertex *pVStack_10;
  ai_real f_local;
  Vertex *v0_local;
  
  local_14 = f;
  pVStack_10 = v0;
  Vertex(__return_storage_ptr__);
  aVar3 = Intern::multiplies<aiVector3t<float>,_float,_aiVector3t<float>_>::operator()
                    (&local_21,&pVStack_10->position,&local_14);
  local_38.z = aVar3.z;
  local_18 = local_38.z;
  local_38._0_8_ = aVar3._0_8_;
  local_20._0_4_ = local_38.x;
  local_20._4_4_ = local_38.y;
  (__return_storage_ptr__->position).z = local_38.z;
  (__return_storage_ptr__->position).x = local_38.x;
  (__return_storage_ptr__->position).y = local_38.y;
  local_38 = aVar3;
  aVar3 = Intern::multiplies<aiVector3t<float>,_float,_aiVector3t<float>_>::operator()
                    (&local_49,&pVStack_10->normal,&local_14);
  local_60.z = aVar3.z;
  local_40 = local_60.z;
  local_60._0_8_ = aVar3._0_8_;
  local_48._0_4_ = local_60.x;
  local_48._4_4_ = local_60.y;
  (__return_storage_ptr__->normal).z = local_60.z;
  (__return_storage_ptr__->normal).x = local_60.x;
  (__return_storage_ptr__->normal).y = local_60.y;
  local_60 = aVar3;
  aVar3 = Intern::multiplies<aiVector3t<float>,_float,_aiVector3t<float>_>::operator()
                    (&local_71,&pVStack_10->tangent,&local_14);
  local_88.z = aVar3.z;
  local_68 = local_88.z;
  local_88._0_8_ = aVar3._0_8_;
  local_70._0_4_ = local_88.x;
  local_70._4_4_ = local_88.y;
  (__return_storage_ptr__->tangent).z = local_88.z;
  (__return_storage_ptr__->tangent).x = local_88.x;
  (__return_storage_ptr__->tangent).y = local_88.y;
  local_88 = aVar3;
  aVar3 = Intern::multiplies<aiVector3t<float>,_float,_aiVector3t<float>_>::operator()
                    (&local_95,&pVStack_10->bitangent,&local_14);
  _uStack_a8 = aVar3._0_8_;
  local_94 = _uStack_a8;
  local_a0 = aVar3.z;
  local_8c = local_a0;
  (__return_storage_ptr__->bitangent).x = (float)uStack_a8;
  (__return_storage_ptr__->bitangent).y = (float)i;
  (__return_storage_ptr__->bitangent).z = local_a0;
  _uStack_a8 = aVar3;
  for (local_ac = 0; local_ac < 8; local_ac = local_ac + 1) {
    aVar3 = Intern::multiplies<aiVector3t<float>,_float,_aiVector3t<float>_>::operator()
                      (&local_b9,pVStack_10->texcoords + local_ac,&local_14);
    _uStack_d0 = aVar3._0_8_;
    local_b8 = _uStack_d0;
    local_c8 = aVar3.z;
    local_b0 = local_c8;
    paVar1 = __return_storage_ptr__->texcoords + local_ac;
    paVar1->x = (float)uStack_d0;
    paVar1->y = (float)i_1;
    paVar1->z = local_c8;
    _uStack_d0 = aVar3;
  }
  for (local_d4 = 0; local_d4 < 8; local_d4 = local_d4 + 1) {
    aVar4 = Intern::multiplies<aiColor4t<float>,_float,_aiColor4t<float>_>::operator()
                      ((multiplies<aiColor4t<float>,_float,_aiColor4t<float>_> *)((long)&res + 3),
                       pVStack_10->colors + local_d4,&local_14);
    paVar2 = __return_storage_ptr__->colors + local_d4;
    stack0xffffffffffffff1c = aVar4._0_8_;
    paVar2->r = (float)res._4_4_;
    paVar2->g = (float)uStack_e0;
    local_dc = aVar4._8_8_;
    paVar2->b = (float)(undefined4)local_dc;
    paVar2->a = (float)local_dc._4_4_;
    unique0x10000309 = aVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, ai_real f) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D,ai_real,aiVector3D>()(v0.position,f);
        res.normal    = op<aiVector3D,ai_real,aiVector3D>()(v0.normal,f);
        res.tangent   = op<aiVector3D,ai_real,aiVector3D>()(v0.tangent,f);
        res.bitangent = op<aiVector3D,ai_real,aiVector3D>()(v0.bitangent,f);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D,ai_real,aiVector3D>()(v0.texcoords[i],f);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D,ai_real,aiColor4D>()(v0.colors[i],f);
        }
        return res;
    }